

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

pair<BigNum,_BigNum> * pairDivMod(pair<BigNum,_BigNum> *__return_storage_ptr__,BigNum *a,BigNum *b)

{
  long lVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  bool bVar5;
  int b_00;
  int iVar6;
  BigNum current;
  BigNum z;
  BigNum result;
  BigNum b_1;
  BigNum b_2;
  BigNum local_2e0;
  pair<BigNum,_BigNum> *local_2c0;
  long local_2b8;
  BigNum local_2b0;
  BigNum local_290;
  BigNum local_270;
  BigNum local_250;
  BigNum local_230;
  BigNum local_210;
  BigNum local_1f0;
  BigNum local_1d0;
  BigNum local_1b0;
  BigNum local_190;
  BigNum local_170;
  BigNum local_150;
  BigNum local_130;
  BigNum local_110;
  BigNum local_f0;
  BigNum local_d0;
  BigNum local_b0;
  BigNum local_90;
  BigNum local_70;
  BigNum local_50;
  
  local_2c0 = __return_storage_ptr__;
  BigNum::BigNum(&local_290,0);
  BigNum::BigNum(&local_270,0);
  local_2b8 = (long)a->length;
  if (0 < local_2b8) {
    do {
      lVar4 = local_2b8;
      lVar1 = local_2b8 + -1;
      bVar5 = local_2b8 <= a->length;
      local_2b8 = lVar1;
      if (bVar5) {
        BigNum::BigNum(&local_1b0,a);
        BigNum::BigNum(&local_50,b);
        bVar5 = operator<(&local_1b0,&local_50);
        if (local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar5) {
          std::pair<BigNum,_BigNum>::pair<BigNum_&,_BigNum_&,_true>(local_2c0,&local_270,a);
          goto LAB_001044ff;
        }
        BigNum::BigNum(&local_90,&local_290);
        operator*(&local_70,&local_90,10);
        operator+(&local_2b0,&local_70,
                  (a->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_2b8]);
        std::vector<int,_std::allocator<int>_>::operator=(&local_290.digits,&local_2b0.digits);
        local_290.sign = local_2b0.sign;
        local_290.length = local_2b0.length;
        if (local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_70.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar5 = true;
        if (b->length <= local_290.length) {
          BigNum::BigNum(&local_1d0,&local_290);
          BigNum::BigNum(&local_250,&local_1d0);
          local_250.sign = true;
          BigNum::BigNum(&local_b0,b);
          BigNum::BigNum(&local_1f0,&local_b0);
          local_1f0.sign = true;
          bVar5 = operator<(&local_250,&local_1f0);
          if (local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1f0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_250.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_250.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_250.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_250.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1d0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (bVar5 == false) {
          BigNum::BigNum(&local_210,&local_290);
          BigNum::BigNum(&local_f0,b);
          b_00 = search(&local_210,&local_f0);
          if (local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_f0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_210.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_210.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_210.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_210.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          BigNum::BigNum(&local_110,b);
          operator*(&local_2b0,&local_110,b_00);
          if (local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_110.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_110.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          BigNum::BigNum(&local_230,&local_290);
          BigNum::BigNum(&local_130,&local_2b0);
          operator-(&local_2e0,&local_230,&local_130);
          std::vector<int,_std::allocator<int>_>::operator=(&local_290.digits,&local_2e0.digits);
          local_290.sign = local_2e0.sign;
          local_290.length = local_2e0.length;
          if (local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_130.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_130.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_130.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_230.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_230.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_230.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_230.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (1 < lVar4) {
            iVar6 = 1;
            do {
              BigNum::BigNum(&local_150,&local_2b0);
              operator*(&local_2e0,&local_150,10);
              std::vector<int,_std::allocator<int>_>::operator=(&local_2b0.digits,&local_2e0.digits)
              ;
              local_2b0.sign = local_2e0.sign;
              local_2b0.length = local_2e0.length;
              if (local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_150.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_150.digits.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_150.digits.super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_150.digits.super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              iVar6 = iVar6 + 1;
            } while ((int)lVar4 != iVar6);
          }
          BigNum::BigNum(&local_190,&local_270);
          operator*(&local_170,&local_190,10);
          operator+(&local_2e0,&local_170,b_00);
          std::vector<int,_std::allocator<int>_>::operator=(&local_270.digits,&local_2e0.digits);
          local_270.sign = local_2e0.sign;
          local_270.length = local_2e0.length;
          if (local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_170.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_170.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_170.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_170.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          piVar2 = local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if (local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_190.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_190.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_190.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            piVar2 = local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar3 = local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          }
        }
        else {
          BigNum::BigNum(&local_d0,&local_270);
          operator*(&local_2b0,&local_d0,10);
          std::vector<int,_std::allocator<int>_>::operator=(&local_270.digits,&local_2b0.digits);
          local_270.sign = local_2b0.sign;
          local_270.length = local_2b0.length;
          piVar2 = local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if (local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2b0.digits.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            piVar2 = local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar3 = local_d0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          }
        }
        if (piVar2 != (pointer)0x0) {
          operator_delete(piVar2,(long)piVar3 - (long)piVar2);
        }
      }
    } while (1 < lVar4);
  }
  std::pair<BigNum,_BigNum>::pair<BigNum_&,_BigNum_&,_true>(local_2c0,&local_270,&local_290);
LAB_001044ff:
  if (local_270.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_270.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_290.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_290.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_290.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_2c0;
}

Assistant:

std::pair<BigNum, BigNum> pairDivMod(BigNum a, BigNum b){
    BigNum z = BigNum(0);
    BigNum result = BigNum(0);
    for (int i = a.length - 1; i >= 0; i--) {
        if(i >= a.length)
            continue;
        if(a < b)
            return  {result, a};
        z = z * 10 + a.digits[i];
        if (z.length < b.length || abs(z) < abs(b)) {
            result = result * 10;
            continue;
        }
        int midresult = search(z, b);
        BigNum current = b * midresult;
        z = z - current;
        for (int j = 0; j < i; j++){
            current = current * 10;
        }
        result = result * 10 + midresult;
    }
    return  {result, z};
}